

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

void __thiscall
QHttpNetworkReplyPrivate::QHttpNetworkReplyPrivate(QHttpNetworkReplyPrivate *this,QUrl *newUrl)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1StringView local_68;
  QLatin1StringView local_58;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate
            (&this->super_QHttpNetworkHeaderPrivate,newUrl);
  *(undefined ***)this = &PTR__QHttpNetworkReplyPrivate_002cd898;
  this->state = NothingDoneState;
  QUrl::QUrl((QUrl *)&local_48);
  QHttpNetworkRequest::QHttpNetworkRequest(&this->request,(QUrl *)&local_48,Get,NormalPriority);
  QUrl::~QUrl((QUrl *)&local_48);
  this->ssl = false;
  (this->errorString).d.d = (Data *)0x0;
  (this->errorString).d.ptr = (char16_t *)0x0;
  (this->errorString).d.size = 0;
  this->bodyLength = 0;
  this->contentRead = 0;
  this->totalProgress = 0;
  (this->fragment).d.d = (Data *)0x0;
  (this->fragment).d.ptr = (char *)0x0;
  *(undefined8 *)((long)&(this->fragment).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->fragment).d.size + 1) = 0;
  this->connectionCloseEnabled = true;
  this->forceConnectionCloseEnabled = false;
  this->lastChunkRead = false;
  this->currentChunkSize = 0;
  this->currentChunkRead = 0;
  this->readBufferMaxSize = 0;
  this->totallyUploadedData = 0;
  this->removedContentLength = -1;
  this->userProvidedDownloadBuffer = (char *)0x0;
  (this->connectionChannel).wp.d = (Data *)0x0;
  (this->connectionChannel).wp.value = (QObject *)0x0;
  *(undefined8 *)((long)&(this->connectionChannel).wp.value + 5) = 0;
  (this->connection).wp.d = (Data *)0x0;
  (this->connection).wp.value = (QObject *)0x0;
  (this->responseData).buffers.d.d = (Data *)0x0;
  (this->responseData).buffers.d.ptr = (QByteArray *)0x0;
  (this->responseData).buffers.d.size = 0;
  (this->responseData).bufferCompleteSize = 0;
  *(undefined8 *)((long)&(this->responseData).bufferCompleteSize + 4) = 0;
  *(undefined8 *)((long)&(this->responseData).firstPos + 4) = 0;
  QUrl::QUrl(&this->redirectUrl);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::scheme();
  local_58.m_size = 0xf;
  local_58.m_data = "preconnect-http";
  bVar1 = ::operator==((QString *)&local_48,&local_58);
  if (!bVar1) {
    local_68.m_size = 0x10;
    local_68.m_data = "preconnect-https";
    bVar1 = ::operator==((QString *)&local_48,&local_68);
    if (!bVar1) goto LAB_001f4c00;
  }
  this->connectionCloseEnabled = false;
LAB_001f4c00:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkReplyPrivate::QHttpNetworkReplyPrivate(const QUrl &newUrl)
    : QHttpNetworkHeaderPrivate(newUrl)
    , state(NothingDoneState)
    , ssl(false),
      bodyLength(0), contentRead(0), totalProgress(0),
      chunkedTransferEncoding(false),
      connectionCloseEnabled(true),
      forceConnectionCloseEnabled(false),
      lastChunkRead(false),
      currentChunkSize(0), currentChunkRead(0), readBufferMaxSize(0),
      totallyUploadedData(0),
      removedContentLength(-1),
      connection(nullptr),
      autoDecompress(false), responseData(), requestIsPrepared(false)
      ,pipeliningUsed(false), h2Used(false), downstreamLimited(false)
      ,userProvidedDownloadBuffer(nullptr)

{
    QString scheme = newUrl.scheme();
    if (scheme == "preconnect-http"_L1 || scheme == "preconnect-https"_L1)
        // make sure we do not close the socket after preconnecting
        connectionCloseEnabled = false;
}